

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  bool bVar1;
  int iVar2;
  string *psVar3;
  long lVar4;
  ostream *poVar5;
  ulong uVar6;
  int *piVar7;
  undefined1 auVar8 [16];
  int local_1e08;
  string local_1b58 [32];
  string local_1b38 [32];
  string local_1b18 [32];
  string local_1af8 [32];
  int local_1ad8 [3];
  int local_1acc [3];
  ulong local_1ac0;
  size_t passProgress;
  ulong local_1a98;
  size_t newSize;
  long local_1a70;
  size_t oldSize;
  string local_1a48;
  string local_1a28;
  undefined1 local_1a08 [8];
  Reducer reducer;
  ulong uStack_1858;
  bool stopping;
  size_t lastPostPassesSize;
  size_t lastDestructiveReductions;
  string local_1840 [4];
  int factor;
  ulong local_1820;
  size_t workingSize;
  string local_17f8 [39];
  allocator<char> local_17d1;
  string local_17d0;
  string local_17b0;
  undefined1 local_1790 [8];
  ProgramResult result;
  string local_1758;
  string local_1738;
  undefined1 local_1718 [8];
  ProgramResult readWrite;
  string local_16e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1680;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1660;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1640;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1620;
  undefined1 local_1600 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15c0;
  Fatal local_15a0;
  string local_1418;
  undefined1 local_13f8 [8];
  ProgramResult resultOnValid;
  undefined1 local_13a8 [8];
  ModuleWriter writer;
  Module emptyModule;
  undefined1 local_fd8 [8];
  ProgramResult resultOnInvalid;
  ofstream dst;
  allocator<char> local_da1;
  string local_da0;
  anon_class_8_1_a7eb7a0b local_d80;
  anon_class_8_1_a7eb7a0b stopIfNotForced;
  string local_d58 [32];
  string local_d38 [32];
  Fatal local_d18;
  Fatal local_b90;
  anon_class_8_1_a81546ea local_a08;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_a00;
  allocator<char> local_9d9;
  string local_9d8 [39];
  anon_class_1_0_00000001 local_9b1;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_9b0;
  allocator<char> local_989;
  string local_988 [39];
  allocator<char> local_961;
  string local_960 [39];
  allocator<char> local_939;
  string local_938 [39];
  anon_class_1_0_00000001 local_911;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_910;
  allocator<char> local_8e9;
  string local_8e8 [39];
  allocator<char> local_8c1;
  string local_8c0 [39];
  allocator<char> local_899;
  string local_898 [32];
  anon_class_8_1_a7eb7a0b local_878;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_870;
  allocator<char> local_849;
  string local_848 [39];
  allocator<char> local_821;
  string local_820 [39];
  allocator<char> local_7f9;
  string local_7f8 [32];
  anon_class_8_1_09c29441 local_7d8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_7d0;
  allocator<char> local_7a9;
  string local_7a8 [39];
  allocator<char> local_781;
  string local_780 [39];
  allocator<char> local_759;
  string local_758 [32];
  anon_class_8_1_9847ac62 local_738;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_730;
  allocator<char> local_709;
  string local_708 [39];
  allocator<char> local_6e1;
  string local_6e0 [39];
  allocator<char> local_6b9;
  string local_6b8 [32];
  anon_class_8_1_a7ca37fa local_698;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_690;
  allocator<char> local_669;
  string local_668 [39];
  allocator<char> local_641;
  string local_640 [39];
  allocator<char> local_619;
  string local_618 [32];
  anon_class_8_1_4e59fd3f local_5f8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_5f0;
  allocator<char> local_5c9;
  string local_5c8 [39];
  allocator<char> local_5a1;
  string local_5a0 [39];
  allocator<char> local_579;
  string local_578 [32];
  anon_class_8_1_4e598f44 local_558;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_550;
  allocator<char> local_529;
  string local_528 [39];
  allocator<char> local_501;
  string local_500 [39];
  allocator<char> local_4d9;
  string local_4d8 [32];
  anon_class_8_1_de425e11 local_4b8;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_4b0;
  allocator<char> local_489;
  string local_488 [39];
  allocator<char> local_461;
  string local_460 [39];
  allocator<char> local_439;
  string local_438 [32];
  anon_class_8_1_8991f190 local_418;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_410;
  allocator<char> local_3e9;
  string local_3e8 [39];
  allocator<char> local_3c1;
  string local_3c0 [39];
  allocator<char> local_399;
  string local_398 [32];
  anon_class_8_1_bc00122b local_378;
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_370;
  allocator<char> local_349;
  string local_348 [39];
  allocator<char> local_321;
  string local_320 [39];
  allocator<char> local_2f9;
  string local_2f8 [39];
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  undefined1 local_288 [8];
  ToolOptions options;
  string local_118 [8];
  string WasmReduceOption;
  bool local_f0;
  bool local_ef;
  bool local_ee;
  bool local_ed [4];
  bool force;
  bool debugInfo;
  bool verbose;
  bool deNan;
  bool binary;
  allocator<char> local_d9;
  string local_d8 [32];
  undefined1 local_b8 [8];
  string binDir;
  string command;
  string working;
  string test;
  string input;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string((string *)(test.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(working.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(command.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(binDir.field_2._M_local_buf + 8));
  __s = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,__s,&local_d9);
  wasm::Path::getDirName((string *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_ed[0] = true;
  local_ee = false;
  local_ef = false;
  local_f0 = false;
  WasmReduceOption.field_2._M_local_buf[0xf] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"wasm-reduce options",
             (allocator<char> *)((long)&options.disabledFeatures.features + 3));
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&options.disabledFeatures.features + 3));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"wasm-reduce",&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,
             "Reduce a wasm file to a smaller one that has the same behavior on a given command",
             &local_2d1);
  wasm::ToolOptions::ToolOptions((ToolOptions *)local_288,&local_2a8,&local_2d0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"--command",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"-cmd",&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_348,
             "The command to run on the test, that we want to reduce while keeping the command\'s output identical. We look at the command\'s return code and stdout here (TODO: stderr), and we reduce while keeping those unchanged."
             ,&local_349);
  local_378.command = (string *)((long)&binDir.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__0,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_370,&local_378);
  psVar3 = (string *)
           wasm::Options::add((string *)local_288,local_2f8,local_320,local_348,(Arguments)local_118
                              ,(function *)0x1,SUB81(&local_370,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"--test",&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"-t",&local_3c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3e8,
             "Test file (this will be written to to test, the given command should read it when we call it)"
             ,&local_3e9);
  local_418.test = (string *)((long)&working.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__1,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_410,&local_418);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_398,local_3c0,local_3e8,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_410,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"--working",&local_439);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"-w",&local_461);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_488,
             "Working file (this will contain the current good state while doing temporary computations, and will contain the final best result at the end)"
             ,&local_489);
  local_4b8.working = (string *)((long)&command.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__2,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_4b0,&local_4b8);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_438,local_460,local_488,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_4b0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4d8,"--binaries",&local_4d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_500,"-b",&local_501);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_528,"binaryen binaries location (bin/ directory)",&local_529);
  local_558.binDir = (string *)local_b8;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__3,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_550,&local_558);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_4d8,local_500,local_528,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_550,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_578,"--text",&local_579);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"-S",&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_5c8,
             "Emit intermediate files as text, instead of binary (also make sure the test and working files have a .wat or .wast suffix)"
             ,&local_5c9);
  local_5f8.binary = local_ed;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__4,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_5f0,&local_5f8);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_578,local_5a0,local_5c8,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_5f0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_618,"--denan",&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_640,"",&local_641);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_668,"Avoid nans when reducing",&local_669);
  local_698.deNan = &local_ee;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__5,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_690,&local_698);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_618,local_640,local_668,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_690,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6b8,"--verbose",&local_6b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"-v",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_708,"Verbose output mode",&local_709);
  local_738.verbose = &local_ef;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__6,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_730,&local_738);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_6b8,local_6e0,local_708,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_730,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_758,"--debugInfo",&local_759);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_780,"-g",&local_781);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_7a8,"Keep debug info in binaries",&local_7a9);
  local_7d8.debugInfo = &local_f0;
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__7,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_7d0,&local_7d8);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_758,local_780,local_7a8,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_7d0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7f8,"--force",&local_7f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_820,"-f",&local_821);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_848,
             "Force the reduction attempt, ignoring problems that imply it is unlikely to succeed",
             &local_849);
  local_878.force = (bool *)((long)&WasmReduceOption.field_2 + 0xf);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__8,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_870,&local_878);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_7f8,local_820,local_848,(Arguments)local_118,
                              (function *)0x0,SUB81(&local_870,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_898,"--timeout",&local_899);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"-to",&local_8c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_8e8,
             "A timeout to apply to each execution of the command, in seconds (default: 2)",
             &local_8e9);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__9,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_910,&local_911);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_898,local_8c0,local_8e8,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_910,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_938,"--extra-flags",&local_939);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_960,"-ef",&local_961);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_988,
             "Extra commandline flags to pass to wasm-opt while reducing. (default: --enable-all)",
             &local_989);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__10,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_9b0,&local_9b1);
  psVar3 = (string *)
           wasm::Options::add(psVar3,local_938,local_960,local_988,(Arguments)local_118,
                              (function *)0x1,SUB81(&local_9b0,0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_9d8,"INFILE",&local_9d9);
  local_a08.input = (string *)((long)&test.field_2 + 8);
  std::function<void(wasm::Options*,std::__cxx11::string_const&)>::function<main::__11,void>
            ((function<void(wasm::Options*,std::__cxx11::string_const&)> *)&local_a00,&local_a08);
  wasm::Options::add_positional(psVar3,(Arguments)local_9d8,(function *)0x1);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_a00);
  std::__cxx11::string::~string(local_9d8);
  std::allocator<char>::~allocator(&local_9d9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_9b0);
  std::__cxx11::string::~string(local_988);
  std::allocator<char>::~allocator(&local_989);
  std::__cxx11::string::~string(local_960);
  std::allocator<char>::~allocator(&local_961);
  std::__cxx11::string::~string(local_938);
  std::allocator<char>::~allocator(&local_939);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_910);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator(&local_8e9);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  std::__cxx11::string::~string(local_898);
  std::allocator<char>::~allocator(&local_899);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_870);
  std::__cxx11::string::~string(local_848);
  std::allocator<char>::~allocator(&local_849);
  std::__cxx11::string::~string(local_820);
  std::allocator<char>::~allocator(&local_821);
  std::__cxx11::string::~string(local_7f8);
  std::allocator<char>::~allocator(&local_7f9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_7d0);
  std::__cxx11::string::~string(local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  std::__cxx11::string::~string(local_780);
  std::allocator<char>::~allocator(&local_781);
  std::__cxx11::string::~string(local_758);
  std::allocator<char>::~allocator(&local_759);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_730);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::__cxx11::string::~string(local_6b8);
  std::allocator<char>::~allocator(&local_6b9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_690);
  std::__cxx11::string::~string(local_668);
  std::allocator<char>::~allocator(&local_669);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::~allocator(&local_641);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator(&local_619);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_5f0);
  std::__cxx11::string::~string(local_5c8);
  std::allocator<char>::~allocator(&local_5c9);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  std::__cxx11::string::~string(local_578);
  std::allocator<char>::~allocator(&local_579);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_550);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator(&local_529);
  std::__cxx11::string::~string(local_500);
  std::allocator<char>::~allocator(&local_501);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_4b0);
  std::__cxx11::string::~string(local_488);
  std::allocator<char>::~allocator(&local_489);
  std::__cxx11::string::~string(local_460);
  std::allocator<char>::~allocator(&local_461);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator(&local_439);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_410);
  std::__cxx11::string::~string(local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  std::__cxx11::string::~string(local_3c0);
  std::allocator<char>::~allocator(&local_3c1);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::
  function<void_(wasm::Options_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function(&local_370);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string(local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  wasm::Options::parse((int)local_288,(char **)(ulong)(uint)argc);
  if ((local_f0 & 1U) != 0) {
    std::__cxx11::string::operator+=((string *)&extraFlags_abi_cxx11_," -g ");
  }
  iVar2 = wasm::getTypeSystem();
  if (iVar2 == 1) {
    std::__cxx11::string::operator+=((string *)&extraFlags_abi_cxx11_," --nominal");
  }
  else {
    iVar2 = wasm::getTypeSystem();
    if (iVar2 != 0) {
      wasm::handle_unreachable
                ("unexpected type system",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
                 ,0x512);
    }
    std::__cxx11::string::operator+=((string *)&extraFlags_abi_cxx11_," --hybrid");
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 0) {
    wasm::Fatal::Fatal(&local_b90);
    wasm::Fatal::operator<<(&local_b90,(char (*) [24])"test file not provided\n");
    wasm::Fatal::~Fatal(&local_b90);
  }
  lVar4 = std::__cxx11::string::size();
  if (lVar4 == 0) {
    wasm::Fatal::Fatal(&local_d18);
    wasm::Fatal::operator<<(&local_d18,(char (*) [27])"working file not provided\n");
    wasm::Fatal::~Fatal(&local_d18);
  }
  if ((local_ed[0] & 1U) == 0) {
    Colors::setEnabled(false);
  }
  wasm::Path::setBinaryenBinDir((string *)local_b8);
  std::operator<<((ostream *)&std::cerr,"|wasm-reduce\n");
  poVar5 = std::operator<<((ostream *)&std::cerr,"|input: ");
  poVar5 = std::operator<<(poVar5,(string *)(test.field_2._M_local_buf + 8));
  std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<((ostream *)&std::cerr,"|test: ");
  poVar5 = std::operator<<(poVar5,(string *)(working.field_2._M_local_buf + 8));
  std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<((ostream *)&std::cerr,"|working: ");
  poVar5 = std::operator<<(poVar5,(string *)(command.field_2._M_local_buf + 8));
  std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<((ostream *)&std::cerr,"|bin dir: ");
  poVar5 = std::operator<<(poVar5,(string *)local_b8);
  std::operator<<(poVar5,'\n');
  poVar5 = std::operator<<((ostream *)&std::cerr,"|extra flags: ");
  poVar5 = std::operator<<(poVar5,(string *)&extraFlags_abi_cxx11_);
  std::operator<<(poVar5,'\n');
  std::__cxx11::string::string(local_d38,(string *)(test.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_d58,(string *)(working.field_2._M_local_buf + 8));
  wasm::copy_file(local_d38,local_d58);
  std::__cxx11::string::~string(local_d58);
  std::__cxx11::string::~string(local_d38);
  std::__cxx11::string::string
            ((string *)&stopIfNotForced,(string *)(binDir.field_2._M_local_buf + 8));
  ProgramResult::getFromExecution(&expected,(string *)&stopIfNotForced);
  std::__cxx11::string::~string((string *)&stopIfNotForced);
  poVar5 = std::operator<<((ostream *)&std::cerr,"|expected result:\n");
  poVar5 = std::operator<<(poVar5,&expected);
  std::operator<<(poVar5,'\n');
  std::operator<<((ostream *)&std::cerr,"|!! Make sure the above is what you expect! !!\n\n");
  local_d80.force = (bool *)((long)&WasmReduceOption.field_2 + 0xf);
  auVar8._8_4_ = (int)(timeout >> 0x20);
  auVar8._0_8_ = timeout;
  auVar8._12_4_ = 0x45300000;
  if ((auVar8._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)timeout) - 4503599627370496.0) <= expected.time + 1.0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_da0,
               "execution time is dangerously close to the timeout - you should probably increase the timeout"
               ,&local_da1);
    main::anon_class_8_1_a7eb7a0b::operator()(&local_d80,&local_da0,&expected);
    std::__cxx11::string::~string((string *)&local_da0);
    std::allocator<char>::~allocator(&local_da1);
  }
  if ((WasmReduceOption.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::operator<<((ostream *)&std::cerr,
                    "|checking that command has different behavior on different inputs (this verifies that the test file is used by the command)\n"
                   );
    std::ofstream::ofstream
              (&resultOnInvalid.time,(string *)(working.field_2._M_local_buf + 8),_S_bin);
    std::operator<<((ostream *)&resultOnInvalid.time,"waka waka\n");
    std::ofstream::~ofstream(&resultOnInvalid.time);
    std::__cxx11::string::string
              ((string *)&emptyModule.tagsMap._M_h._M_single_bucket,
               (string *)(binDir.field_2._M_local_buf + 8));
    ProgramResult::ProgramResult
              ((ProgramResult *)local_fd8,(string *)&emptyModule.tagsMap._M_h._M_single_bucket);
    std::__cxx11::string::~string((string *)&emptyModule.tagsMap._M_h._M_single_bucket);
    bVar1 = ProgramResult::operator==((ProgramResult *)local_fd8,&expected);
    if (bVar1) {
      wasm::Module::Module((Module *)((long)&writer.sourceMapUrl.field_2 + 8));
      wasm::ModuleWriter::ModuleWriter((ModuleWriter *)local_13a8);
      wasm::ModuleWriter::setBinary((ModuleWriter *)local_13a8,true);
      std::__cxx11::string::string
                ((string *)&resultOnValid.time,(string *)(working.field_2._M_local_buf + 8));
      wasm::ModuleWriter::write
                (local_13a8,(undefined1 *)((long)&writer.sourceMapUrl.field_2 + 8),
                 &resultOnValid.time);
      std::__cxx11::string::~string((string *)&resultOnValid.time);
      std::__cxx11::string::string
                ((string *)&local_1418,(string *)(binDir.field_2._M_local_buf + 8));
      ProgramResult::ProgramResult((ProgramResult *)local_13f8,&local_1418);
      std::__cxx11::string::~string((string *)&local_1418);
      bVar1 = ProgramResult::operator==((ProgramResult *)local_13f8,&expected);
      if (bVar1) {
        wasm::Fatal::Fatal(&local_15a0);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cmd.field_2 + 8),
                       "running the command on the given input gives the same result as when running it on either a trivial valid wasm or a file with nonsense in it. does the script not look at the test file ("
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        ((long)&working.field_2 + 8));
        std::operator+(&local_15c0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&cmd.field_2 + 8),")? (use -f to ignore this check)");
        wasm::Fatal::operator<<(&local_15a0,&local_15c0);
        std::__cxx11::string::~string((string *)&local_15c0);
        std::__cxx11::string::~string((string *)(cmd.field_2._M_local_buf + 8));
        wasm::Fatal::~Fatal(&local_15a0);
      }
      ProgramResult::~ProgramResult((ProgramResult *)local_13f8);
      wasm::ModuleWriter::~ModuleWriter((ModuleWriter *)local_13a8);
      wasm::Module::~Module((Module *)((long)&writer.sourceMapUrl.field_2 + 8));
    }
    ProgramResult::~ProgramResult((ProgramResult *)local_fd8);
  }
  std::operator<<((ostream *)&std::cerr,
                  "|checking that command has expected behavior on canonicalized (read-written) binary\n"
                 );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_16e0,"wasm-opt",(allocator<char> *)((long)&readWrite.time + 7));
  wasm::Path::getBinaryenBinaryTool((string *)&local_16c0);
  std::operator+(&local_16a0,&local_16c0," ");
  std::operator+(&local_1680,&local_16a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&test.field_2 + 8));
  std::operator+(&local_1660,&local_1680," -o ");
  std::operator+(&local_1640,&local_1660,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&working.field_2 + 8));
  std::operator+(&local_1620,&local_1640," ");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1600,
                 &local_1620,&extraFlags_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_1620);
  std::__cxx11::string::~string((string *)&local_1640);
  std::__cxx11::string::~string((string *)&local_1660);
  std::__cxx11::string::~string((string *)&local_1680);
  std::__cxx11::string::~string((string *)&local_16a0);
  std::__cxx11::string::~string((string *)&local_16c0);
  std::__cxx11::string::~string(local_16e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&readWrite.time + 7));
  if ((local_ed[0] & 1U) == 0) {
    std::__cxx11::string::operator+=((string *)local_1600," -S ");
  }
  std::__cxx11::string::string((string *)&local_1738,(string *)local_1600);
  ProgramResult::ProgramResult((ProgramResult *)local_1718,&local_1738);
  std::__cxx11::string::~string((string *)&local_1738);
  bVar1 = ProgramResult::failed((ProgramResult *)local_1718);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1758,"failed to read and write the binary",
               (allocator<char> *)((long)&result.time + 7));
    main::anon_class_8_1_a7eb7a0b::operator()(&local_d80,&local_1758,(ProgramResult *)local_1718);
    std::__cxx11::string::~string((string *)&local_1758);
    std::allocator<char>::~allocator((allocator<char> *)((long)&result.time + 7));
  }
  else {
    std::__cxx11::string::string((string *)&local_17b0,(string *)(binDir.field_2._M_local_buf + 8));
    ProgramResult::ProgramResult((ProgramResult *)local_1790,&local_17b0);
    std::__cxx11::string::~string((string *)&local_17b0);
    bVar1 = ProgramResult::operator!=((ProgramResult *)local_1790,&expected);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_17d0,
                 "running command on the canonicalized module should give the same results",
                 &local_17d1);
      main::anon_class_8_1_a7eb7a0b::operator()(&local_d80,&local_17d0,(ProgramResult *)local_1790);
      std::__cxx11::string::~string((string *)&local_17d0);
      std::allocator<char>::~allocator(&local_17d1);
    }
    ProgramResult::~ProgramResult((ProgramResult *)local_1790);
  }
  ProgramResult::~ProgramResult((ProgramResult *)local_1718);
  std::__cxx11::string::~string((string *)local_1600);
  std::__cxx11::string::string(local_17f8,(string *)(test.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&workingSize,(string *)(command.field_2._M_local_buf + 8));
  wasm::copy_file(local_17f8,&workingSize);
  std::__cxx11::string::~string((string *)&workingSize);
  std::__cxx11::string::~string(local_17f8);
  std::__cxx11::string::string(local_1840,(string *)(command.field_2._M_local_buf + 8));
  uVar6 = wasm::file_size(local_1840);
  std::__cxx11::string::~string(local_1840);
  local_1820 = uVar6;
  poVar5 = std::operator<<((ostream *)&std::cerr,"|input size: ");
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1820);
  std::operator<<(poVar5,"\n");
  std::operator<<((ostream *)&std::cerr,"|starting reduction!\n");
  if ((local_ed[0] & 1U) == 0) {
    local_1e08 = (int)(local_1820 / 10);
  }
  else {
    local_1e08 = (int)(local_1820 << 1);
  }
  lastDestructiveReductions._4_4_ = local_1e08;
  lastPostPassesSize = 0;
  uStack_1858 = 0;
  reducer.decisionCounter._7_1_ = 0;
  do {
    std::__cxx11::string::string((string *)&local_1a28,(string *)(binDir.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&local_1a48,(string *)(working.field_2._M_local_buf + 8))
    ;
    std::__cxx11::string::string((string *)&oldSize,(string *)(command.field_2._M_local_buf + 8));
    Reducer::Reducer((Reducer *)local_1a08,&local_1a28,&local_1a48,(string *)&oldSize,
                     (bool)(local_ed[0] & 1),(bool)(local_ee & 1),(bool)(local_ef & 1),
                     (bool)(local_f0 & 1),(ToolOptions *)local_288);
    std::__cxx11::string::~string((string *)&oldSize);
    std::__cxx11::string::~string((string *)&local_1a48);
    std::__cxx11::string::~string((string *)&local_1a28);
    std::operator<<((ostream *)&std::cerr,"|  reduce using passes...\n");
    std::__cxx11::string::string((string *)&newSize,(string *)(command.field_2._M_local_buf + 8));
    lVar4 = wasm::file_size(&newSize);
    std::__cxx11::string::~string((string *)&newSize);
    local_1a70 = lVar4;
    Reducer::reduceUsingPasses((Reducer *)local_1a08);
    std::__cxx11::string::string
              ((string *)&passProgress,(string *)(command.field_2._M_local_buf + 8));
    uVar6 = wasm::file_size(&passProgress);
    std::__cxx11::string::~string((string *)&passProgress);
    local_1ac0 = local_1a70 - uVar6;
    local_1a98 = uVar6;
    poVar5 = std::operator<<((ostream *)&std::cerr,"|  after pass reduction: ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1a98);
    std::operator<<(poVar5,"\n");
    if ((reducer.decisionCounter._7_1_ & 1) == 0) {
      if ((uStack_1858 != 0) && (uStack_1858 <= local_1a98)) {
        std::operator<<((ostream *)&std::cerr,"|  progress has stopped, skipping to the end\n");
        if (lastDestructiveReductions._4_4_ == 1) {
          reducer.decisionCounter._7_1_ = 1;
        }
        else {
          lastDestructiveReductions._4_4_ = (lastDestructiveReductions._4_4_ + 1) / 2;
        }
      }
      uStack_1858 = local_1a98;
      poVar5 = std::operator<<((ostream *)&std::cerr,"|  pass progress: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_1ac0);
      poVar5 = std::operator<<(poVar5,", last destructive: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,lastPostPassesSize);
      std::operator<<(poVar5,'\n');
      if (local_1ac0 < lastPostPassesSize << 2) {
        if (lastDestructiveReductions._4_4_ < 0xb) {
          lastDestructiveReductions._4_4_ = (lastDestructiveReductions._4_4_ + 1) / 2;
        }
        else {
          lastDestructiveReductions._4_4_ = lastDestructiveReductions._4_4_ / 3 + 1;
        }
      }
      else {
        std::operator<<((ostream *)&std::cerr,
                        "|  progress is good, do not quickly decrease factor\n");
        local_1acc[1] = 1;
        local_1acc[0] = (lastDestructiveReductions._4_4_ * 9) / 10;
        piVar7 = std::max<int>(local_1acc + 1,local_1acc);
        lastDestructiveReductions._4_4_ = *piVar7;
      }
      if (local_1a98 < 5) {
        __assert_fail("newSize > 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/wasm-reduce.cpp"
                      ,0x5b4,"int main(int, const char **)");
      }
      local_1ad8[2] = (int)local_1a98;
      if ((int)local_1a98 < 0) {
        local_1ad8[2] = (int)local_1a98 + 3;
      }
      local_1ad8[2] = local_1ad8[2] >> 2;
      piVar7 = std::min<int>((int *)((long)&lastDestructiveReductions + 4),local_1ad8 + 2);
      lastDestructiveReductions._4_4_ = *piVar7;
      while( true ) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"|  reduce destructively... (factor: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,lastDestructiveReductions._4_4_);
        std::operator<<(poVar5,")\n");
        lastPostPassesSize =
             Reducer::reduceDestructively((Reducer *)local_1a08,lastDestructiveReductions._4_4_);
        if (lastPostPassesSize != 0) break;
        if (lastDestructiveReductions._4_4_ == 1) {
          reducer.decisionCounter._7_1_ = 1;
          break;
        }
        local_1ad8[1] = 1;
        local_1ad8[0] = lastDestructiveReductions._4_4_;
        if (lastDestructiveReductions._4_4_ < 0) {
          local_1ad8[0] = lastDestructiveReductions._4_4_ + 3;
        }
        local_1ad8[0] = local_1ad8[0] >> 2;
        piVar7 = std::max<int>(local_1ad8 + 1,local_1ad8);
        lastDestructiveReductions._4_4_ = *piVar7;
      }
      poVar5 = std::operator<<((ostream *)&std::cerr,"|  destructive reduction led to size: ");
      std::__cxx11::string::string(local_1af8,(string *)(command.field_2._M_local_buf + 8));
      uVar6 = wasm::file_size(local_1af8);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
      std::operator<<(poVar5,'\n');
      std::__cxx11::string::~string(local_1af8);
      local_1acc[2] = 0;
    }
    else {
      local_1acc[2] = 3;
    }
    Reducer::~Reducer((Reducer *)local_1a08);
    if (local_1acc[2] != 0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"|finished, final size: ");
      std::__cxx11::string::string(local_1b18,(string *)(command.field_2._M_local_buf + 8));
      uVar6 = wasm::file_size(local_1b18);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar6);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string(local_1b18);
      std::__cxx11::string::string(local_1b38,(string *)(command.field_2._M_local_buf + 8));
      std::__cxx11::string::string(local_1b58,(string *)(working.field_2._M_local_buf + 8));
      wasm::copy_file(local_1b38,local_1b58);
      std::__cxx11::string::~string(local_1b58);
      std::__cxx11::string::~string(local_1b38);
      wasm::ToolOptions::~ToolOptions((ToolOptions *)local_288);
      std::__cxx11::string::~string(local_118);
      std::__cxx11::string::~string((string *)local_b8);
      std::__cxx11::string::~string((string *)(binDir.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(working.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(test.field_2._M_local_buf + 8));
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, const char* argv[]) {
  std::string input, test, working, command;
  // By default, look for binaries alongside our own binary.
  std::string binDir = Path::getDirName(argv[0]);
  bool binary = true, deNan = false, verbose = false, debugInfo = false,
       force = false;

  const std::string WasmReduceOption = "wasm-reduce options";

  ToolOptions options("wasm-reduce",
                      "Reduce a wasm file to a smaller one that has the same "
                      "behavior on a given command");
  options
    .add("--command",
         "-cmd",
         "The command to run on the test, that we want to reduce while keeping "
         "the command's output identical. "
         "We look at the command's return code and stdout here (TODO: stderr), "
         "and we reduce while keeping those unchanged.",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { command = argument; })
    .add("--test",
         "-t",
         "Test file (this will be written to to test, the given command should "
         "read it when we call it)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { test = argument; })
    .add("--working",
         "-w",
         "Working file (this will contain the current good state while doing "
         "temporary computations, "
         "and will contain the final best result at the end)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) { working = argument; })
    .add("--binaries",
         "-b",
         "binaryen binaries location (bin/ directory)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           // Add separator just in case
           binDir = argument + Path::getPathSeparator();
         })
    .add("--text",
         "-S",
         "Emit intermediate files as text, instead of binary (also make sure "
         "the test and working files have a .wat or .wast suffix)",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { binary = false; })
    .add("--denan",
         "",
         "Avoid nans when reducing",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { deNan = true; })
    .add("--verbose",
         "-v",
         "Verbose output mode",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { verbose = true; })
    .add("--debugInfo",
         "-g",
         "Keep debug info in binaries",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { debugInfo = true; })
    .add("--force",
         "-f",
         "Force the reduction attempt, ignoring problems that imply it is "
         "unlikely to succeed",
         WasmReduceOption,
         Options::Arguments::Zero,
         [&](Options* o, const std::string& argument) { force = true; })
    .add("--timeout",
         "-to",
         "A timeout to apply to each execution of the command, in seconds "
         "(default: 2)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           timeout = atoi(argument.c_str());
           std::cout << "|applying timeout: " << timeout << "\n";
         })
    .add("--extra-flags",
         "-ef",
         "Extra commandline flags to pass to wasm-opt while reducing. "
         "(default: --enable-all)",
         WasmReduceOption,
         Options::Arguments::One,
         [&](Options* o, const std::string& argument) {
           extraFlags = argument;
           std::cout << "|applying extraFlags: " << extraFlags << "\n";
         })
    .add_positional(
      "INFILE",
      Options::Arguments::One,
      [&](Options* o, const std::string& argument) { input = argument; });
  options.parse(argc, argv);

  if (debugInfo) {
    extraFlags += " -g ";
  }
  if (getTypeSystem() == TypeSystem::Nominal) {
    extraFlags += " --nominal";
  } else if (getTypeSystem() == TypeSystem::Isorecursive) {
    extraFlags += " --hybrid";
  } else {
    WASM_UNREACHABLE("unexpected type system");
  }

  if (test.size() == 0) {
    Fatal() << "test file not provided\n";
  }
  if (working.size() == 0) {
    Fatal() << "working file not provided\n";
  }

  if (!binary) {
    Colors::setEnabled(false);
  }

  Path::setBinaryenBinDir(binDir);

  std::cerr << "|wasm-reduce\n";
  std::cerr << "|input: " << input << '\n';
  std::cerr << "|test: " << test << '\n';
  std::cerr << "|working: " << working << '\n';
  std::cerr << "|bin dir: " << binDir << '\n';
  std::cerr << "|extra flags: " << extraFlags << '\n';

  // get the expected output
  copy_file(input, test);
  expected.getFromExecution(command);

  std::cerr << "|expected result:\n" << expected << '\n';
  std::cerr << "|!! Make sure the above is what you expect! !!\n\n";

  auto stopIfNotForced = [&](std::string message, ProgramResult& result) {
    std::cerr << "|! " << message << '\n' << result << '\n';
    if (!force) {
      Fatal() << "|! stopping, as it is very unlikely reduction can succeed "
                 "(use -f to ignore this check)";
    }
  };

  if (expected.time + 1 >= timeout) {
    stopIfNotForced("execution time is dangerously close to the timeout - you "
                    "should probably increase the timeout",
                    expected);
  }

  if (!force) {
    std::cerr << "|checking that command has different behavior on different "
                 "inputs (this "
                 "verifies that the test file is used by the command)\n";
    // Try it on an invalid input.
    {
      std::ofstream dst(test, std::ios::binary);
      dst << "waka waka\n";
    }
    ProgramResult resultOnInvalid(command);
    if (resultOnInvalid == expected) {
      // Try it on a valid input.
      Module emptyModule;
      ModuleWriter writer;
      writer.setBinary(true);
      writer.write(emptyModule, test);
      ProgramResult resultOnValid(command);
      if (resultOnValid == expected) {
        Fatal()
          << "running the command on the given input gives the same result as "
             "when running it on either a trivial valid wasm or a file with "
             "nonsense in it. does the script not look at the test file (" +
               test + ")? (use -f to ignore this check)";
      }
    }
  }

  std::cerr << "|checking that command has expected behavior on canonicalized "
               "(read-written) binary\n";
  {
    // read and write it
    auto cmd = Path::getBinaryenBinaryTool("wasm-opt") + " " + input + " -o " +
               test + " " + extraFlags;
    if (!binary) {
      cmd += " -S ";
    }
    ProgramResult readWrite(cmd);
    if (readWrite.failed()) {
      stopIfNotForced("failed to read and write the binary", readWrite);
    } else {
      ProgramResult result(command);
      if (result != expected) {
        stopIfNotForced("running command on the canonicalized module should "
                        "give the same results",
                        result);
      }
    }
  }

  copy_file(input, working);
  auto workingSize = file_size(working);
  std::cerr << "|input size: " << workingSize << "\n";

  std::cerr << "|starting reduction!\n";

  int factor = binary ? workingSize * 2 : workingSize / 10;

  size_t lastDestructiveReductions = 0;
  size_t lastPostPassesSize = 0;

  bool stopping = false;

  while (1) {
    Reducer reducer(
      command, test, working, binary, deNan, verbose, debugInfo, options);

    // run binaryen optimization passes to reduce. passes are fast to run
    // and can often reduce large amounts of code efficiently, as opposed
    // to detructive reduction (i.e., that doesn't preserve correctness as
    // passes do) since destrucive must operate one change at a time
    std::cerr << "|  reduce using passes...\n";
    auto oldSize = file_size(working);
    reducer.reduceUsingPasses();
    auto newSize = file_size(working);
    auto passProgress = oldSize - newSize;
    std::cerr << "|  after pass reduction: " << newSize << "\n";

    // always stop after a pass reduction attempt, for final cleanup
    if (stopping) {
      break;
    }

    // check if the full cycle (destructive/passes) has helped or not
    if (lastPostPassesSize && newSize >= lastPostPassesSize) {
      std::cerr << "|  progress has stopped, skipping to the end\n";
      if (factor == 1) {
        // this is after doing work with factor 1, so after the remaining work,
        // stop
        stopping = true;
      } else {
        // decrease the factor quickly
        factor = (factor + 1) / 2; // stable on 1
      }
    }
    lastPostPassesSize = newSize;

    // If destructive reductions lead to useful proportionate pass reductions,
    // keep going at the same factor, as pass reductions are far faster.
    std::cerr << "|  pass progress: " << passProgress
              << ", last destructive: " << lastDestructiveReductions << '\n';
    if (passProgress >= 4 * lastDestructiveReductions) {
      std::cerr << "|  progress is good, do not quickly decrease factor\n";
      // While the amount of pass reductions is proportionately high, we do
      // still want to reduce the factor by some amount. If we do not then there
      // is a risk that both pass and destructive reductions are very low, and
      // we get "stuck" cycling through them. In that case we simply need to do
      // more destructive reductions to make real progress. For that reason,
      // decrease the factor by some small percentage.
      factor = std::max(1, (factor * 9) / 10);
    } else {
      if (factor > 10) {
        factor = (factor / 3) + 1;
      } else {
        factor = (factor + 1) / 2; // stable on 1
      }
    }

    // no point in a factor lorger than the size
    assert(newSize > 4); // wasm modules are >4 bytes anyhow
    factor = std::min(factor, int(newSize) / 4);

    // try to reduce destructively. if a high factor fails to find anything,
    // quickly try a lower one (no point in doing passes until we reduce
    // destructively at least a little)
    while (1) {
      std::cerr << "|  reduce destructively... (factor: " << factor << ")\n";
      lastDestructiveReductions = reducer.reduceDestructively(factor);
      if (lastDestructiveReductions > 0) {
        break;
      }
      // we failed to reduce destructively
      if (factor == 1) {
        stopping = true;
        break;
      }
      factor = std::max(
        1, factor / 4); // quickly now, try to find *something* we can reduce
    }

    std::cerr << "|  destructive reduction led to size: " << file_size(working)
              << '\n';
  }
  std::cerr << "|finished, final size: " << file_size(working) << "\n";
  copy_file(working, test); // just to avoid confusion
}